

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb__stb_idict_rehash(stb_idict *a,int count)

{
  stb__stb_idict__hashpair *__ptr;
  int in_R9D;
  long lVar1;
  stb_idict b;
  
  stb_idict_init(&b,count);
  for (lVar1 = 0; __ptr = a->table, lVar1 < a->limit; lVar1 = lVar1 + 1) {
    if ((__ptr[lVar1].k | 2U) != 3) {
      stb__stb_idict_addset(&b,__ptr[lVar1].k,__ptr[lVar1].v,1,1,in_R9D);
    }
  }
  free(__ptr);
  a->table = b.table;
  a->mask = b.mask;
  a->count = b.count;
  a->limit = b.limit;
  a->deleted = b.deleted;
  a->delete_threshhold = b.delete_threshhold;
  a->grow_threshhold = b.grow_threshhold;
  a->shrink_threshhold = b.shrink_threshhold;
  return;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}